

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O0

int Abc_MfsNodeDeref_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode_local;
  
  local_28 = 1;
  iVar1 = Abc_ObjIsCi(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_24 < iVar1; local_24 = local_24 + 1) {
      pNode_00 = Abc_ObjFanin(pNode,local_24);
      if ((pNode_00->vFanouts).nSize < 1) {
        __assert_fail("pFanin->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsDiv.c"
                      ,0x7f,"int Abc_MfsNodeDeref_rec(Abc_Obj_t *)");
      }
      iVar1 = (pNode_00->vFanouts).nSize + -1;
      (pNode_00->vFanouts).nSize = iVar1;
      if (iVar1 == 0) {
        iVar1 = Abc_MfsNodeDeref_rec(pNode_00);
        local_28 = iVar1 + local_28;
      }
    }
    pNode_local._4_4_ = local_28;
  }
  else {
    pNode_local._4_4_ = 0;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_MfsNodeDeref_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNode );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        assert( pFanin->vFanouts.nSize > 0 );
        if ( --pFanin->vFanouts.nSize == 0 )
            Counter += Abc_MfsNodeDeref_rec( pFanin );
    }
    return Counter;
}